

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

bool __thiscall sf::Texture::loadFromImage(Texture *this,Image *image,IntRect *area)

{
  uint uVar1;
  uint uVar2;
  uint width;
  bool bVar3;
  uint uVar4;
  Vector2u VVar5;
  Vector2u VVar6;
  Uint8 *pUVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  TransientContextLock lock;
  TextureSaver save;
  
  VVar5 = Image::getSize(image);
  VVar6 = Image::getSize(image);
  uVar1 = area->width;
  if ((uVar1 == 0) || (uVar2 = area->height, uVar2 == 0)) {
LAB_001b9c86:
    VVar5 = Image::getSize(image);
    VVar6 = Image::getSize(image);
    bVar3 = create(this,VVar5.x,VVar6.y);
    if (!bVar3) {
      iVar10 = 0;
      goto LAB_001b9cc1;
    }
    update(this,image);
  }
  else {
    iVar11 = area->left;
    iVar8 = area->top;
    uVar9 = VVar5.x;
    uVar4 = VVar6.y;
    if (((int)uVar4 <= (int)uVar2 && (int)uVar9 <= (int)uVar1) && (iVar8 < 1 && iVar11 < 1))
    goto LAB_001b9c86;
    iVar10 = 0;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    if (iVar8 < 1) {
      iVar8 = iVar10;
    }
    width = uVar9 - iVar11;
    if ((int)(iVar11 + uVar1) <= (int)uVar9) {
      width = uVar1;
    }
    uVar1 = uVar4 - iVar8;
    if ((int)(iVar8 + uVar2) <= (int)uVar4) {
      uVar1 = uVar2;
    }
    bVar3 = create(this,width,uVar1);
    if (!bVar3) goto LAB_001b9cc1;
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::TextureSaver::TextureSaver(&save);
    pUVar7 = Image::getPixelsPtr(image);
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    if (0 < (int)uVar1) {
      pUVar7 = pUVar7 + (int)((iVar8 * uVar9 + iVar11) * 4);
      iVar11 = 0;
      do {
        (*sf_glad_glTexSubImage2D)(0xde1,0,0,iVar11,width,1,0x1908,0x1401,pUVar7);
        pUVar7 = pUVar7 + (int)(uVar9 << 2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < (int)uVar1);
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
    this->m_hasMipmap = false;
    (*sf_glad_glFlush)();
    priv::TextureSaver::~TextureSaver(&save);
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  iVar10 = 1;
LAB_001b9cc1:
  return SUB41(iVar10,0);
}

Assistant:

bool Texture::loadFromImage(const Image& image, const IntRect& area)
{
    // Retrieve the image size
    int width = static_cast<int>(image.getSize().x);
    int height = static_cast<int>(image.getSize().y);

    // Load the entire image if the source area is either empty or contains the whole image
    if (area.width == 0 || (area.height == 0) ||
       ((area.left <= 0) && (area.top <= 0) && (area.width >= width) && (area.height >= height)))
    {
        // Load the entire image
        if (create(image.getSize().x, image.getSize().y))
        {
            update(image);

            return true;
        }
        else
        {
            return false;
        }
    }
    else
    {
        // Load a sub-area of the image

        // Adjust the rectangle to the size of the image
        IntRect rectangle = area;
        if (rectangle.left   < 0) rectangle.left = 0;
        if (rectangle.top    < 0) rectangle.top  = 0;
        if (rectangle.left + rectangle.width > width)  rectangle.width  = width - rectangle.left;
        if (rectangle.top + rectangle.height > height) rectangle.height = height - rectangle.top;

        // Create the texture and upload the pixels
        if (create(static_cast<unsigned int>(rectangle.width), static_cast<unsigned int>(rectangle.height)))
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            // Copy the pixels to the texture, row by row
            const Uint8* pixels = image.getPixelsPtr() + 4 * (rectangle.left + (width * rectangle.top));
            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            for (int i = 0; i < rectangle.height; ++i)
            {
                glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
                pixels += 4 * width;
            }

            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            m_hasMipmap = false;

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());

            return true;
        }
        else
        {
            return false;
        }
    }
}